

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith_uint256.cpp
# Opt level: O0

uint __thiscall base_uint<256U>::bits(base_uint<256U> *this)

{
  long in_RDI;
  long in_FS_OFFSET;
  int nbits;
  int pos;
  undefined4 local_20;
  undefined4 local_1c;
  undefined4 local_c;
  
  for (local_1c = 7; -1 < local_1c; local_1c = local_1c + -1) {
    if (*(int *)(in_RDI + (long)local_1c * 4) != 0) {
      local_20 = 0x1f;
      goto LAB_00e7d950;
    }
  }
  local_c = 0;
LAB_00e7d9c5:
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return local_c;
  }
  __stack_chk_fail();
LAB_00e7d950:
  if (local_20 < 1) goto LAB_00e7d99b;
  if ((*(uint *)(in_RDI + (long)local_1c * 4) & 1 << ((byte)local_20 & 0x1f)) != 0) {
    local_c = local_1c * 0x20 + local_20 + 1;
    goto LAB_00e7d9c5;
  }
  local_20 = local_20 + -1;
  goto LAB_00e7d950;
LAB_00e7d99b:
  local_c = local_1c * 0x20 + 1;
  goto LAB_00e7d9c5;
}

Assistant:

unsigned int base_uint<BITS>::bits() const
{
    for (int pos = WIDTH - 1; pos >= 0; pos--) {
        if (pn[pos]) {
            for (int nbits = 31; nbits > 0; nbits--) {
                if (pn[pos] & 1U << nbits)
                    return 32 * pos + nbits + 1;
            }
            return 32 * pos + 1;
        }
    }
    return 0;
}